

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O1

int mbedtls_mpi_write_string(mbedtls_mpi *X,int radix,char *buf,size_t buflen,size_t *olen)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  ulong uVar5;
  long lVar6;
  size_t sVar7;
  ulong uVar8;
  char *__dest;
  mbedtls_mpi T;
  mbedtls_mpi _B;
  mbedtls_mpi_uint r;
  mbedtls_mpi_uint local_98;
  mbedtls_mpi local_90;
  mbedtls_mpi local_78;
  size_t *local_60;
  char *local_58;
  ulong local_50;
  size_t local_48;
  long local_40;
  ulong local_38;
  
  if (radix - 0x11U < 0xfffffff1) {
    return -4;
  }
  sVar4 = mbedtls_mpi_bitlen(X);
  uVar5 = (sVar4 >> (3 < radix)) >> (0xf < radix);
  uVar5 = uVar5 + ((int)uVar5 + 3U & 1) + 3;
  if (buflen < uVar5) {
    *olen = uVar5;
    return -8;
  }
  local_90.s = 1;
  local_90.n = 0;
  local_90.p = (mbedtls_mpi_uint *)0x0;
  __dest = buf;
  if (X->s == -1) {
    __dest = buf + 1;
    *buf = '-';
    buflen = buflen - 1;
  }
  local_58 = buf;
  if (radix == 0x10) {
    sVar4 = X->n;
    if (sVar4 != 0) {
      bVar2 = false;
      do {
        lVar6 = 0x38;
        sVar7 = 0xfffffffffffffffa;
        do {
          uVar5 = X->p[sVar4 - 1] >> ((byte)lVar6 & 0x3f);
          uVar8 = uVar5 & 0xff;
          if (((sVar4 == sVar7) || ((int)uVar8 != 0)) || (bVar2)) {
            *__dest = "0123456789ABCDEF"[uVar8 >> 4];
            __dest[1] = "0123456789ABCDEF"[(uint)uVar5 & 0xf];
            __dest = __dest + 2;
            bVar2 = true;
          }
          else {
            bVar2 = false;
          }
          lVar6 = lVar6 + -8;
          sVar7 = sVar7 + 1;
        } while (lVar6 != -8);
        sVar4 = sVar4 - 1;
      } while (sVar4 != 0);
    }
  }
  else {
    iVar3 = mbedtls_mpi_copy(&local_90,X);
    if (iVar3 != 0) goto LAB_0011cd05;
    if (local_90.s == -1) {
      local_90.s = 1;
    }
    lVar6 = 0;
    local_60 = olen;
    local_50 = (ulong)(uint)radix;
    local_48 = buflen;
    do {
      uVar5 = local_50;
      if (local_48 + lVar6 == 0) {
        iVar3 = -8;
        goto LAB_0011ccf8;
      }
      local_40 = lVar6;
      iVar3 = mbedtls_mpi_mod_int(&local_38,&local_90,local_50);
      if (iVar3 != 0) goto LAB_0011ccf8;
      local_78.s = 1;
      local_78.n = 1;
      local_98 = uVar5;
      local_78.p = &local_98;
      iVar3 = mbedtls_mpi_div_mpi(&local_90,(mbedtls_mpi *)0x0,&local_90,&local_78);
      lVar6 = local_40;
      if (iVar3 != 0) goto LAB_0011ccf8;
      bVar1 = (byte)local_38 + 0x37;
      if (local_38 < 10) {
        bVar1 = (byte)local_38 | 0x30;
      }
      __dest[local_40 + (buflen - 1)] = bVar1;
      local_98 = 0;
      local_78.s = 1;
      local_78.n = 1;
      local_78.p = &local_98;
      iVar3 = mbedtls_mpi_cmp_mpi(&local_90,&local_78);
      lVar6 = lVar6 + -1;
    } while (iVar3 != 0);
    memmove(__dest,__dest + lVar6 + buflen,-lVar6);
    __dest = __dest + -lVar6;
    iVar3 = 0;
LAB_0011ccf8:
    olen = local_60;
    if (iVar3 != 0) goto LAB_0011cd05;
  }
  *__dest = '\0';
  *olen = (size_t)(__dest + (1 - (long)local_58));
  iVar3 = 0;
LAB_0011cd05:
  mbedtls_mpi_free(&local_90);
  return iVar3;
}

Assistant:

int mbedtls_mpi_write_string( const mbedtls_mpi *X, int radix,
                              char *buf, size_t buflen, size_t *olen )
{
    int ret = 0;
    size_t n;
    char *p;
    mbedtls_mpi T;
    MPI_VALIDATE_RET( X    != NULL );
    MPI_VALIDATE_RET( olen != NULL );
    MPI_VALIDATE_RET( buflen == 0 || buf != NULL );

    if( radix < 2 || radix > 16 )
        return( MBEDTLS_ERR_MPI_BAD_INPUT_DATA );

    n = mbedtls_mpi_bitlen( X ); /* Number of bits necessary to present `n`. */
    if( radix >=  4 ) n >>= 1;   /* Number of 4-adic digits necessary to present
                                  * `n`. If radix > 4, this might be a strict
                                  * overapproximation of the number of
                                  * radix-adic digits needed to present `n`. */
    if( radix >= 16 ) n >>= 1;   /* Number of hexadecimal digits necessary to
                                  * present `n`. */

    n += 1; /* Terminating null byte */
    n += 1; /* Compensate for the divisions above, which round down `n`
             * in case it's not even. */
    n += 1; /* Potential '-'-sign. */
    n += ( n & 1 ); /* Make n even to have enough space for hexadecimal writing,
                     * which always uses an even number of hex-digits. */

    if( buflen < n )
    {
        *olen = n;
        return( MBEDTLS_ERR_MPI_BUFFER_TOO_SMALL );
    }

    p = buf;
    mbedtls_mpi_init( &T );

    if( X->s == -1 )
    {
        *p++ = '-';
        buflen--;
    }

    if( radix == 16 )
    {
        int c;
        size_t i, j, k;

        for( i = X->n, k = 0; i > 0; i-- )
        {
            for( j = ciL; j > 0; j-- )
            {
                c = ( X->p[i - 1] >> ( ( j - 1 ) << 3) ) & 0xFF;

                if( c == 0 && k == 0 && ( i + j ) != 2 )
                    continue;

                *(p++) = "0123456789ABCDEF" [c / 16];
                *(p++) = "0123456789ABCDEF" [c % 16];
                k = 1;
            }
        }
    }
    else
    {
        MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &T, X ) );

        if( T.s == -1 )
            T.s = 1;

        MBEDTLS_MPI_CHK( mpi_write_hlp( &T, radix, &p, buflen ) );
    }

    *p++ = '\0';
    *olen = p - buf;

cleanup:

    mbedtls_mpi_free( &T );

    return( ret );
}